

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

int BN_mod_exp_mont(BIGNUM *rr,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx,BN_MONT_CTX *in_mont)

{
  bool bVar1;
  int iVar2;
  BN_CTX *a_00;
  BIGNUM *r_00;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BN_MONT_CTX *mont;
  BIGNUM *val [32];
  BIGNUM *aa;
  BIGNUM *r;
  BIGNUM *d;
  int start;
  int wvalue;
  int window;
  int wend;
  int wstart;
  int ret;
  int bits;
  int j;
  int i;
  BN_CTX *in_stack_fffffffffffffe68;
  int words;
  BN_CTX *ctx_00;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  uint in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  uint uVar5;
  uint uVar6;
  BN_MONT_CTX *mont_00;
  BIGNUM *in_stack_fffffffffffffe90;
  BIGNUM *in_stack_fffffffffffffe98;
  int local_50;
  int local_4c;
  int local_48;
  int local_3c;
  
  local_48 = 0;
  mont_00 = (BN_MONT_CTX *)0x0;
  iVar2 = BN_get_flags(p,4);
  if (((iVar2 != 0) || (iVar2 = BN_get_flags(a,4), iVar2 != 0)) ||
     (iVar2 = BN_get_flags(m,4), iVar2 != 0)) {
    iVar2 = BN_mod_exp_mont_consttime
                      ((BIGNUM *)rr,(BIGNUM *)a,(BIGNUM *)p,(BIGNUM *)m,(BN_CTX *)ctx,
                       (BN_MONT_CTX *)in_mont);
    return iVar2;
  }
  iVar2 = BN_is_odd(m);
  if (iVar2 == 0) {
    ERR_new();
    ERR_set_debug((char *)mont_00,in_stack_fffffffffffffe7c,
                  (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    ERR_set_error(3,0x66,(char *)0x0);
    return 0;
  }
  local_4c = BN_num_bits((BIGNUM *)p);
  if (local_4c == 0) {
    iVar2 = BN_abs_is_word(m,1);
    if (iVar2 == 0) {
      local_48 = BN_set_word((BIGNUM *)rr,1);
    }
    else {
      local_48 = 1;
      BN_zero_ex(rr);
    }
    return local_48;
  }
  BN_CTX_start((BN_CTX *)ctx);
  BN_CTX_get((BN_CTX *)ctx);
  a_00 = (BN_CTX *)BN_CTX_get((BN_CTX *)ctx);
  r_00 = BN_CTX_get((BN_CTX *)ctx);
  if (((r_00 != (BIGNUM *)0x0) &&
      ((mont_00 = (BN_MONT_CTX *)in_mont, in_mont != (BN_MONT_CTX *)0x0 ||
       ((mont_00 = BN_MONT_CTX_new(), mont_00 != (BN_MONT_CTX *)0x0 &&
        (iVar2 = BN_MONT_CTX_set(mont_00,(BIGNUM *)m,(BN_CTX *)ctx), iVar2 != 0)))))) &&
     (((a->neg == 0 && (iVar2 = BN_ucmp((BIGNUM *)a,(BIGNUM *)m), iVar2 < 0)) ||
      (iVar2 = BN_nnmod(r_00,(BIGNUM *)a,(BIGNUM *)m,(BN_CTX *)ctx), iVar2 != 0)))) {
    iVar2 = bn_to_mont_fixed_top
                      ((BIGNUM *)mont_00,
                       (BIGNUM *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (BN_MONT_CTX *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe68);
    words = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (iVar2 != 0) {
      if (local_4c < 0x2a0) {
        if (local_4c < 0xf0) {
          if (local_4c < 0x50) {
            in_stack_fffffffffffffe74 = 1;
            in_stack_fffffffffffffe78 = in_stack_fffffffffffffe74;
            uVar5 = in_stack_fffffffffffffe74;
            if (0x17 < local_4c) {
              in_stack_fffffffffffffe74 = 3;
              in_stack_fffffffffffffe78 = in_stack_fffffffffffffe74;
              uVar5 = in_stack_fffffffffffffe74;
            }
          }
          else {
            in_stack_fffffffffffffe74 = 4;
            in_stack_fffffffffffffe78 = in_stack_fffffffffffffe74;
            uVar5 = in_stack_fffffffffffffe74;
          }
        }
        else {
          in_stack_fffffffffffffe78 = 5;
          uVar5 = 5;
        }
      }
      else {
        uVar5 = 6;
      }
      uVar6 = uVar5;
      if (1 < uVar5) {
        iVar2 = bn_mul_mont_fixed_top
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(BIGNUM *)r_00,
                           (BN_MONT_CTX *)mont_00,
                           (BN_CTX *)CONCAT44(uVar5,in_stack_fffffffffffffe78));
        if (iVar2 == 0) goto LAB_00221f77;
        for (local_3c = 1; words = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
            local_3c < 1 << ((char)uVar5 - 1U & 0x1f); local_3c = local_3c + 1) {
          pBVar3 = BN_CTX_get((BN_CTX *)ctx);
          *(BIGNUM **)(&stack0xfffffffffffffe88 + (long)local_3c * 8) = pBVar3;
          if ((pBVar3 == (BIGNUM *)0x0) ||
             (iVar2 = bn_mul_mont_fixed_top
                                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(BIGNUM *)r_00,
                                 (BN_MONT_CTX *)mont_00,
                                 (BN_CTX *)CONCAT44(uVar6,in_stack_fffffffffffffe78)), iVar2 == 0))
          goto LAB_00221f77;
        }
      }
      bVar1 = true;
      local_4c = local_4c + -1;
      iVar2 = m->top;
      if ((m->d[iVar2 + -1] & 0x8000000000000000) == 0) {
        ctx_00 = a_00;
        BN_value_one();
        iVar2 = bn_to_mont_fixed_top
                          ((BIGNUM *)mont_00,(BIGNUM *)CONCAT44(uVar6,in_stack_fffffffffffffe78),
                           (BN_MONT_CTX *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),ctx_00);
        if (iVar2 == 0) goto LAB_00221f77;
      }
      else {
        pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            words);
        if (pBVar4 == (BIGNUM *)0x0) goto LAB_00221f77;
        ((a_00->pool).head)->vals[0].d = (unsigned_long *)-*m->d;
        for (local_3c = 1; local_3c < iVar2; local_3c = local_3c + 1) {
          (&((a_00->pool).head)->vals[0].d)[local_3c] =
               (unsigned_long *)(m->d[local_3c] ^ 0xffffffffffffffff);
        }
        *(int *)&(a_00->pool).current = iVar2;
        *(int *)((long)&(a_00->pool).tail + 4) = *(int *)((long)&(a_00->pool).tail + 4);
      }
      do {
        while (iVar2 = BN_is_bit_set((BIGNUM *)p,local_4c), iVar2 == 0) {
          if ((!bVar1) &&
             (iVar2 = bn_mul_mont_fixed_top
                                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(BIGNUM *)r_00,
                                 (BN_MONT_CTX *)mont_00,
                                 (BN_CTX *)CONCAT44(uVar6,in_stack_fffffffffffffe78)), iVar2 == 0))
          goto LAB_00221f77;
          if (local_4c == 0) goto LAB_00221f43;
          local_4c = local_4c + -1;
        }
        local_50 = 0;
        for (local_3c = 1; (local_3c < (int)uVar5 && (-1 < local_4c - local_3c));
            local_3c = local_3c + 1) {
          iVar2 = BN_is_bit_set((BIGNUM *)p,local_4c - local_3c);
          if (iVar2 != 0) {
            local_50 = local_3c;
          }
        }
        if (!bVar1) {
          for (local_3c = 0; local_3c < local_50 + 1; local_3c = local_3c + 1) {
            iVar2 = bn_mul_mont_fixed_top
                              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(BIGNUM *)r_00,
                               (BN_MONT_CTX *)mont_00,
                               (BN_CTX *)CONCAT44(uVar6,in_stack_fffffffffffffe78));
            if (iVar2 == 0) goto LAB_00221f77;
          }
        }
        iVar2 = bn_mul_mont_fixed_top
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(BIGNUM *)r_00,
                           (BN_MONT_CTX *)mont_00,
                           (BN_CTX *)CONCAT44(uVar6,in_stack_fffffffffffffe78));
        if (iVar2 == 0) goto LAB_00221f77;
        local_4c = local_4c - (local_50 + 1);
        bVar1 = false;
      } while (-1 < local_4c);
LAB_00221f43:
      iVar2 = BN_from_montgomery((BIGNUM *)rr,(BIGNUM *)a_00,mont_00,(BN_CTX *)ctx);
      if (iVar2 != 0) {
        local_48 = 1;
      }
    }
  }
LAB_00221f77:
  if (in_mont == (BN_MONT_CTX *)0x0) {
    BN_MONT_CTX_free(mont_00);
  }
  BN_CTX_end((BN_CTX *)ctx);
  return local_48;
}

Assistant:

int BN_mod_exp_mont(BIGNUM *rr, const BIGNUM *a, const BIGNUM *p,
                    const BIGNUM *m, BN_CTX *ctx, BN_MONT_CTX *in_mont)
{
    int i, j, bits, ret = 0, wstart, wend, window, wvalue;
    int start = 1;
    BIGNUM *d, *r;
    const BIGNUM *aa;
    /* Table of variables obtained from 'ctx' */
    BIGNUM *val[TABLE_SIZE];
    BN_MONT_CTX *mont = NULL;

    if (BN_get_flags(p, BN_FLG_CONSTTIME) != 0
            || BN_get_flags(a, BN_FLG_CONSTTIME) != 0
            || BN_get_flags(m, BN_FLG_CONSTTIME) != 0) {
        return BN_mod_exp_mont_consttime(rr, a, p, m, ctx, in_mont);
    }

    bn_check_top(a);
    bn_check_top(p);
    bn_check_top(m);

    if (!BN_is_odd(m)) {
        ERR_raise(ERR_LIB_BN, BN_R_CALLED_WITH_EVEN_MODULUS);
        return 0;
    }
    bits = BN_num_bits(p);
    if (bits == 0) {
        /* x**0 mod 1, or x**0 mod -1 is still zero. */
        if (BN_abs_is_word(m, 1)) {
            ret = 1;
            BN_zero(rr);
        } else {
            ret = BN_one(rr);
        }
        return ret;
    }

    BN_CTX_start(ctx);
    d = BN_CTX_get(ctx);
    r = BN_CTX_get(ctx);
    val[0] = BN_CTX_get(ctx);
    if (val[0] == NULL)
        goto err;

    /*
     * If this is not done, things will break in the montgomery part
     */

    if (in_mont != NULL)
        mont = in_mont;
    else {
        if ((mont = BN_MONT_CTX_new()) == NULL)
            goto err;
        if (!BN_MONT_CTX_set(mont, m, ctx))
            goto err;
    }

    if (a->neg || BN_ucmp(a, m) >= 0) {
        if (!BN_nnmod(val[0], a, m, ctx))
            goto err;
        aa = val[0];
    } else
        aa = a;
    if (!bn_to_mont_fixed_top(val[0], aa, mont, ctx))
        goto err;               /* 1 */

    window = BN_window_bits_for_exponent_size(bits);
    if (window > 1) {
        if (!bn_mul_mont_fixed_top(d, val[0], val[0], mont, ctx))
            goto err;           /* 2 */
        j = 1 << (window - 1);
        for (i = 1; i < j; i++) {
            if (((val[i] = BN_CTX_get(ctx)) == NULL) ||
                !bn_mul_mont_fixed_top(val[i], val[i - 1], d, mont, ctx))
                goto err;
        }
    }

    start = 1;                  /* This is used to avoid multiplication etc
                                 * when there is only the value '1' in the
                                 * buffer. */
    wvalue = 0;                 /* The 'value' of the window */
    wstart = bits - 1;          /* The top bit of the window */
    wend = 0;                   /* The bottom bit of the window */

#if 1                           /* by Shay Gueron's suggestion */
    j = m->top;                 /* borrow j */
    if (m->d[j - 1] & (((BN_ULONG)1) << (BN_BITS2 - 1))) {
        if (bn_wexpand(r, j) == NULL)
            goto err;
        /* 2^(top*BN_BITS2) - m */
        r->d[0] = (0 - m->d[0]) & BN_MASK2;
        for (i = 1; i < j; i++)
            r->d[i] = (~m->d[i]) & BN_MASK2;
        r->top = j;
        r->flags |= BN_FLG_FIXED_TOP;
    } else
#endif
    if (!bn_to_mont_fixed_top(r, BN_value_one(), mont, ctx))
        goto err;
    for (;;) {
        if (BN_is_bit_set(p, wstart) == 0) {
            if (!start) {
                if (!bn_mul_mont_fixed_top(r, r, r, mont, ctx))
                    goto err;
            }
            if (wstart == 0)
                break;
            wstart--;
            continue;
        }
        /*
         * We now have wstart on a 'set' bit, we now need to work out how bit
         * a window to do.  To do this we need to scan forward until the last
         * set bit before the end of the window
         */
        wvalue = 1;
        wend = 0;
        for (i = 1; i < window; i++) {
            if (wstart - i < 0)
                break;
            if (BN_is_bit_set(p, wstart - i)) {
                wvalue <<= (i - wend);
                wvalue |= 1;
                wend = i;
            }
        }

        /* wend is the size of the current window */
        j = wend + 1;
        /* add the 'bytes above' */
        if (!start)
            for (i = 0; i < j; i++) {
                if (!bn_mul_mont_fixed_top(r, r, r, mont, ctx))
                    goto err;
            }

        /* wvalue will be an odd number < 2^window */
        if (!bn_mul_mont_fixed_top(r, r, val[wvalue >> 1], mont, ctx))
            goto err;

        /* move the 'window' down further */
        wstart -= wend + 1;
        wvalue = 0;
        start = 0;
        if (wstart < 0)
            break;
    }
    /*
     * Done with zero-padded intermediate BIGNUMs. Final BN_from_montgomery
     * removes padding [if any] and makes return value suitable for public
     * API consumer.
     */
#if defined(SPARC_T4_MONT)
    if (OPENSSL_sparcv9cap_P[0] & (SPARCV9_VIS3 | SPARCV9_PREFER_FPU)) {
        j = mont->N.top;        /* borrow j */
        val[0]->d[0] = 1;       /* borrow val[0] */
        for (i = 1; i < j; i++)
            val[0]->d[i] = 0;
        val[0]->top = j;
        if (!BN_mod_mul_montgomery(rr, r, val[0], mont, ctx))
            goto err;
    } else
#endif
    if (!BN_from_montgomery(rr, r, mont, ctx))
        goto err;
    ret = 1;
 err:
    if (in_mont == NULL)
        BN_MONT_CTX_free(mont);
    BN_CTX_end(ctx);
    bn_check_top(rr);
    return ret;
}